

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_error(Pager *pPager,int rc)

{
  int rc2;
  int rc_local;
  Pager *pPager_local;
  
  if (((rc & 0xffU) == 0xd) || ((rc & 0xffU) == 10)) {
    pPager->errCode = rc;
    pPager->eState = '\x06';
    setGetterMethod(pPager);
  }
  return rc;
}

Assistant:

static int pager_error(Pager *pPager, int rc){
  int rc2 = rc & 0xff;
  assert( rc==SQLITE_OK || !MEMDB );
  assert(
       pPager->errCode==SQLITE_FULL ||
       pPager->errCode==SQLITE_OK ||
       (pPager->errCode & 0xff)==SQLITE_IOERR
  );
  if( rc2==SQLITE_FULL || rc2==SQLITE_IOERR ){
    pPager->errCode = rc;
    pPager->eState = PAGER_ERROR;
    setGetterMethod(pPager);
  }
  return rc;
}